

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O3

BaseState<true> * __thiscall
ArrayToVectorState<true,_float>::Float
          (ArrayToVectorState<true,_float> *this,Context<true> *param_1,float f)

{
  pointer *ppfVar1;
  vector<float,_std::allocator<float>_> *this_00;
  iterator __position;
  float local_c;
  
  this_00 = this->output_array;
  __position._M_current =
       (this_00->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (__position._M_current ==
      (this_00->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    local_c = f;
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
              (this_00,__position,&local_c);
  }
  else {
    *__position._M_current = f;
    ppfVar1 = &(this_00->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppfVar1 = *ppfVar1 + 1;
  }
  return &this->super_BaseState<true>;
}

Assistant:

BaseState<audit>* Float(Context<audit>& /* ctx */, float f)
  {
    output_array->push_back((T)f);
    return this;
  }